

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_engine.cpp
# Opt level: O0

void __thiscall zmq::udp_engine_t::~udp_engine_t(udp_engine_t *this)

{
  udp_engine_t *in_stack_00000010;
  
  ~udp_engine_t(in_stack_00000010);
  return;
}

Assistant:

zmq::udp_engine_t::~udp_engine_t ()
{
    zmq_assert (!_plugged);

    if (_fd != retired_fd) {
#ifdef ZMQ_HAVE_WINDOWS
        const int rc = closesocket (_fd);
        wsa_assert (rc != SOCKET_ERROR);
#else
        int rc = close (_fd);
        errno_assert (rc == 0);
#endif
        _fd = retired_fd;
    }
}